

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

With * sqlite3WithAdd(Parse *pParse,With *pWith,Token *pName,ExprList *pArglist,Select *pQuery)

{
  sqlite3 *db;
  int iVar1;
  char *zLeft;
  With *pWVar2;
  ulong n;
  long lVar3;
  int iVar4;
  Cte *pCVar5;
  
  db = pParse->db;
  zLeft = sqlite3NameFromToken(db,pName);
  if (pWith == (With *)0x0 || zLeft == (char *)0x0) {
    if (pWith == (With *)0x0) {
      pWVar2 = (With *)sqlite3DbMallocZero(db,0x30);
      goto LAB_0022ecfe;
    }
    iVar4 = pWith->nCte;
  }
  else {
    iVar4 = pWith->nCte;
    if (0 < iVar4) {
      pCVar5 = pWith->a;
      lVar3 = 0;
      do {
        iVar1 = sqlite3StrICmp(zLeft,pCVar5->zName);
        if (iVar1 == 0) {
          sqlite3ErrorMsg(pParse,"duplicate WITH table name: %s",zLeft);
          iVar4 = pWith->nCte;
        }
        lVar3 = lVar3 + 1;
        pCVar5 = pCVar5 + 1;
      } while (lVar3 < iVar4);
    }
  }
  n = (ulong)(iVar4 * 0x20 + 0x30);
  if (((pWith < (With *)(db->lookaside).pStart) || ((With *)(db->lookaside).pEnd <= pWith)) ||
     (pWVar2 = pWith, (db->lookaside).sz < n)) {
    pWVar2 = (With *)dbReallocFinish(db,pWith,n);
  }
LAB_0022ecfe:
  if (db->mallocFailed == '\0') {
    iVar4 = pWVar2->nCte;
    pWVar2->a[iVar4].pSelect = pQuery;
    pWVar2->a[iVar4].pCols = pArglist;
    pWVar2->a[iVar4].zName = zLeft;
    pWVar2->a[iVar4].zCteErr = (char *)0x0;
    pWVar2->nCte = iVar4 + 1;
  }
  else {
    if (pArglist != (ExprList *)0x0) {
      exprListDeleteNN(db,pArglist);
    }
    if (pQuery != (Select *)0x0) {
      clearSelect(db,pQuery,1);
    }
    pWVar2 = pWith;
    if (zLeft != (char *)0x0) {
      sqlite3DbFreeNN(db,zLeft);
    }
  }
  return pWVar2;
}

Assistant:

SQLITE_PRIVATE With *sqlite3WithAdd(
  Parse *pParse,          /* Parsing context */
  With *pWith,            /* Existing WITH clause, or NULL */
  Token *pName,           /* Name of the common-table */
  ExprList *pArglist,     /* Optional column name list for the table */
  Select *pQuery          /* Query used to initialize the table */
){
  sqlite3 *db = pParse->db;
  With *pNew;
  char *zName;

  /* Check that the CTE name is unique within this WITH clause. If
  ** not, store an error in the Parse structure. */
  zName = sqlite3NameFromToken(pParse->db, pName);
  if( zName && pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      if( sqlite3StrICmp(zName, pWith->a[i].zName)==0 ){
        sqlite3ErrorMsg(pParse, "duplicate WITH table name: %s", zName);
      }
    }
  }

  if( pWith ){
    int nByte = sizeof(*pWith) + (sizeof(pWith->a[1]) * pWith->nCte);
    pNew = sqlite3DbRealloc(db, pWith, nByte);
  }else{
    pNew = sqlite3DbMallocZero(db, sizeof(*pWith));
  }
  assert( (pNew!=0 && zName!=0) || db->mallocFailed );

  if( db->mallocFailed ){
    sqlite3ExprListDelete(db, pArglist);
    sqlite3SelectDelete(db, pQuery);
    sqlite3DbFree(db, zName);
    pNew = pWith;
  }else{
    pNew->a[pNew->nCte].pSelect = pQuery;
    pNew->a[pNew->nCte].pCols = pArglist;
    pNew->a[pNew->nCte].zName = zName;
    pNew->a[pNew->nCte].zCteErr = 0;
    pNew->nCte++;
  }

  return pNew;
}